

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

FT_Error get_min_distance_cubic(SDF_Edge *cubic,FT_26D6_Vec point,SDF_Signed_Distance *out)

{
  long lVar1;
  long lVar2;
  FT_Char FVar3;
  FT_Int32 FVar4;
  FT_Int32 FVar5;
  FT_Int32 FVar6;
  FT_Int32 FVar7;
  FT_Int32 FVar8;
  FT_Int32 FVar9;
  FT_Int32 FVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  FT_Fixed FVar17;
  FT_Long FVar18;
  long lVar19;
  int a;
  int a_00;
  int a_01;
  int a_02;
  FT_16D16 temp2;
  FT_16D16 temp1;
  FT_26D6_Vec d2;
  FT_26D6_Vec d1;
  FT_16D16_Vec dist_vector;
  FT_16D16_Vec curve_point;
  FT_16D16 length;
  FT_16D16 factor3;
  FT_16D16 factor2;
  FT_16D16 factor;
  FT_UShort steps;
  FT_UShort iterations;
  FT_16D16 min;
  FT_16D16 cross;
  FT_16D16 min_factor_sq;
  FT_16D16 min_factor;
  FT_26D6_Vec p;
  FT_26D6_Vec p3;
  FT_26D6_Vec p2;
  FT_26D6_Vec p1;
  FT_26D6_Vec p0;
  FT_16D16_Vec direction;
  FT_16D16_Vec nearest_point;
  FT_26D6_Vec dD;
  FT_26D6_Vec cC;
  FT_26D6_Vec bB;
  FT_26D6_Vec aA;
  FT_Error error;
  SDF_Signed_Distance *out_local;
  SDF_Edge *cubic_local;
  FT_26D6_Vec point_local;
  
  lVar19 = point.x;
  aA.y._4_4_ = 0;
  cross = 0;
  min = 0;
  factor = 0x7fffffff;
  if ((cubic == (SDF_Edge *)0x0) || (out == (SDF_Signed_Distance *)0x0)) {
    aA.y._4_4_ = 6;
  }
  else if (cubic->edge_type == SDF_EDGE_CUBIC) {
    lVar1 = (cubic->start_pos).x;
    lVar2 = (cubic->start_pos).y;
    lVar13 = (cubic->control_a).x;
    lVar14 = (cubic->control_a).y;
    lVar11 = (cubic->control_b).x;
    lVar12 = (cubic->control_b).y;
    a = (((int)lVar13 - (int)lVar11) * 3 - (int)lVar1) + (int)(cubic->end_pos).x;
    a_00 = (((int)lVar14 - (int)lVar12) * 3 - (int)lVar2) + (int)(cubic->end_pos).y;
    lVar11 = lVar1 + lVar13 * -2 + lVar11;
    a_01 = (int)lVar11 * 3;
    lVar12 = lVar2 + lVar14 * -2 + lVar12;
    a_02 = (int)lVar12 * 3;
    lVar13 = (lVar13 - lVar1) * 3;
    lVar14 = (lVar14 - lVar2) * 3;
    p0.x = lVar2;
    for (factor2._2_2_ = 0; factor2._2_2_ < 5; factor2._2_2_ = factor2._2_2_ + 1) {
      factor3 = (int)((uint)factor2._2_2_ << 0x10) / 4;
      for (factor2._0_2_ = 0; (ushort)factor2 < 4; factor2._0_2_ = (ushort)factor2 + 1) {
        FVar4 = FT_MulFix_x86_64(factor3,factor3);
        FVar5 = FT_MulFix_x86_64(FVar4,factor3);
        FVar6 = FT_MulFix_x86_64(a,FVar5);
        FVar7 = FT_MulFix_x86_64(a_01,FVar4);
        FVar8 = FT_MulFix_x86_64((FT_Int32)lVar13,factor3);
        FVar5 = FT_MulFix_x86_64(a_00,FVar5);
        FVar9 = FT_MulFix_x86_64(a_02,FVar4);
        FVar10 = FT_MulFix_x86_64((FT_Int32)lVar14,factor3);
        lVar15 = ((FVar6 + FVar7 + FVar8) + lVar1) * 0x400;
        lVar16 = ((FVar5 + FVar9 + FVar10) + lVar2) * 0x400;
        d1.y = lVar15 + lVar19 * -0x400;
        FVar17 = FT_Vector_Length((FT_Vector *)&d1.y);
        if ((int)FVar17 < factor) {
          cross = factor3;
          factor = (int)FVar17;
          min = FVar4;
          direction.y = lVar15;
          nearest_point.x = lVar16;
        }
        FVar5 = FT_MulFix_x86_64(a,FVar4 * 3);
        FVar6 = FT_MulFix_x86_64(a_01,factor3 << 1);
        lVar15 = (FVar5 + FVar6) + lVar13;
        FVar4 = FT_MulFix_x86_64(a_00,FVar4 * 3);
        FVar5 = FT_MulFix_x86_64(a_02,factor3 << 1);
        d1.x = (FVar4 + FVar5) + lVar14;
        FVar4 = FT_MulFix_x86_64(a,factor3 * 6);
        FVar5 = FT_MulFix_x86_64(a_00,factor3 * 6);
        d1.y = d1.y / 0x400;
        lVar16 = (lVar16 + point.y * -0x400) / 0x400;
        FVar18 = FT_DivFix((long)((int)((d1.y * lVar15) / 0x40) + (int)((lVar16 * d1.x) / 0x40)),
                           (long)((int)((lVar15 * lVar15) / 0x40) + (int)((d1.x * d1.x) / 0x40) +
                                 (int)((d1.y * ((long)FVar4 + lVar11 * 6)) / 0x40) +
                                 (int)((lVar16 * ((long)FVar5 + lVar12 * 6)) / 0x40)));
        factor3 = factor3 - (int)FVar18;
        if ((factor3 < 0) || (0x10000 < factor3)) break;
      }
    }
    FVar4 = FT_MulFix_x86_64(a,min * 3);
    FVar5 = FT_MulFix_x86_64(a_01,cross << 1);
    p0.y = (FVar4 + FVar5) + lVar13;
    FVar4 = FT_MulFix_x86_64(a_00,min * 3);
    FVar5 = FT_MulFix_x86_64(a_02,cross << 1);
    direction.x = (FVar4 + FVar5) + lVar14;
    FVar4 = FT_MulFix_x86_64((int)direction.y - (int)(lVar19 << 10),(FT_Int32)direction.x);
    FVar5 = FT_MulFix_x86_64((int)nearest_point.x - (int)(point.y << 10),(FT_Int32)p0.y);
    out->distance = factor;
    FVar3 = -1;
    if (FVar4 - FVar5 < 0) {
      FVar3 = '\x01';
    }
    out->sign = FVar3;
    if ((cross == 0) || (cross == 0x10000)) {
      direction.y = direction.y + lVar19 * -0x400;
      FT_Vector_NormLen((FT_Vector *)&p0.y);
      FT_Vector_NormLen((FT_Vector *)&direction.y);
      FVar4 = FT_MulFix_x86_64((FT_Int32)p0.y,(int)nearest_point.x + (int)point.y * -0x400);
      FVar5 = FT_MulFix_x86_64((FT_Int32)direction.x,(FT_Int32)direction.y);
      out->cross = FVar4 - FVar5;
    }
    else {
      out->cross = 0x10000;
    }
  }
  else {
    aA.y._4_4_ = 6;
  }
  return aA.y._4_4_;
}

Assistant:

static FT_Error
  get_min_distance_cubic( SDF_Edge*             cubic,
                          FT_26D6_Vec           point,
                          SDF_Signed_Distance*  out )
  {
    /*
     * The procedure to find the shortest distance from a point to a cubic
     * Bezier curve is similar to quadratic curve algorithm.  The only
     * difference is that while calculating factor `t`, instead of a cubic
     * polynomial equation we have to find the roots of a 5th degree
     * polynomial equation.  Solving this would require a significant amount
     * of time, and still the results may not be accurate.  We are thus
     * going to directly approximate the value of `t` using the Newton-Raphson
     * method.
     *
     * Let's assume that
     *
     * ```
     * p0 = first endpoint
     * p1 = first control point
     * p2 = second control point
     * p3 = second endpoint
     * p  = point from which shortest distance is to be calculated
     * ```
     *
     * (1) The equation of a cubic Bezier curve can be written as
     *
     *     ```
     *     B(t) = (1 - t)^3 * p0 + 3(1 - t)^2 t * p1 +
     *              3(1 - t)t^2 * p2 + t^3 * p3
     *     ```
     *
     *     The equation can be expanded and written as
     *
     *     ```
     *     B(t) = t^3 * (-p0 + 3p1 - 3p2 + p3) +
     *              3t^2 * (p0 - 2p1 + p2) + 3t * (-p0 + p1) + p0
     *     ```
     *
     *     With
     *
     *     ```
     *     A = -p0 + 3p1 - 3p2 + p3
     *     B = 3(p0 - 2p1 + p2)
     *     C = 3(-p0 + p1)
     *     ```
     *
     *     we have
     *
     *     ```
     *     B(t) = t^3 * A + t^2 * B + t * C + p0
     *     ```
     *
     * (2) The derivative of the above equation is
     *
     *     ```
     *     B'(t) = 3t^2 * A + 2t * B + C
     *     ```
     *
     * (3) The second derivative of the above equation is
     *
     *     ```
     *     B''(t) = 6t * A + 2B
     *     ```
     *
     * (4) The equation `P(t)` of the distance from point `p` to the curve
     *     can be written as
     *
     *     ```
     *     P(t) = t^3 * A + t^2 * B + t * C + p0 - p
     *     ```
     *
     *     With
     *
     *     ```
     *     D = p0 - p
     *     ```
     *
     *     we have
     *
     *     ```
     *     P(t) = t^3 * A + t^2 * B + t * C + D
     *     ```
     *
     * (5) Finally the equation of the angle between `B(t)` and `P(t)` can
     *     be written as
     *
     *     ```
     *     Q(t) = P(t) . B'(t)
     *     ```
     *
     * (6) Our task is to find a value of `t` such that the above equation
     *     `Q(t)` becomes zero, this is, the point-to-curve vector makes
     *     90~degree with curve.  We solve this with the Newton-Raphson
     *     method.
     *
     * (7) We first assume an arbitary value of factor `t`, which we then
     *     improve.
     *
     *     ```
     *     t := Q(t) / Q'(t)
     *     ```
     *
     *     Putting the value of `Q(t)` from the above equation gives
     *
     *     ```
     *     t := P(t) . B'(t) / derivative(P(t) . B'(t))
     *     t := P(t) . B'(t) /
     *            (P'(t) . B'(t) + P(t) . B''(t))
     *     ```
     *
     *     Note that `P'(t)` is the same as `B'(t)` because the constant is
     *     gone due to the derivative.
     *
     * (8) Finally we get the equation to improve the factor as
     *
     *     ```
     *     t := P(t) . B'(t) /
     *            (B'(t) . B'( t ) + P(t) . B''(t))
     *     ```
     *
     * [note]: `B` and `B(t)` are different in the above equations.
     */

    FT_Error  error = FT_Err_Ok;

    FT_26D6_Vec   aA, bB, cC, dD; /* A, B, C in the above comment          */
    FT_16D16_Vec  nearest_point;  /* point on curve nearest to `point`     */
    FT_16D16_Vec  direction;      /* direction of curve at `nearest_point` */

    FT_26D6_Vec  p0, p1, p2, p3;  /* control points of a cubic curve       */
    FT_26D6_Vec  p;               /* `point` to which shortest distance    */

    FT_16D16  min_factor    = 0;            /* factor at shortest distance */
    FT_16D16  min_factor_sq = 0;            /* factor at shortest distance */
    FT_16D16  cross;                        /* to determine the sign       */
    FT_16D16  min           = FT_INT_MAX;   /* shortest distance           */

    FT_UShort  iterations;
    FT_UShort  steps;


    if ( !cubic || !out )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( cubic->edge_type != SDF_EDGE_CUBIC )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    p0 = cubic->start_pos;
    p1 = cubic->control_a;
    p2 = cubic->control_b;
    p3 = cubic->end_pos;
    p  = point;

    /* compute substitution coefficients */
    aA.x = -p0.x + 3 * ( p1.x - p2.x ) + p3.x;
    aA.y = -p0.y + 3 * ( p1.y - p2.y ) + p3.y;

    bB.x = 3 * ( p0.x - 2 * p1.x + p2.x );
    bB.y = 3 * ( p0.y - 2 * p1.y + p2.y );

    cC.x = 3 * ( p1.x - p0.x );
    cC.y = 3 * ( p1.y - p0.y );

    dD.x = p0.x;
    dD.y = p0.y;

    for ( iterations = 0; iterations <= MAX_NEWTON_DIVISIONS; iterations++ )
    {
      FT_16D16  factor  = FT_INT_16D16( iterations ) / MAX_NEWTON_DIVISIONS;

      FT_16D16  factor2;         /* factor^2            */
      FT_16D16  factor3;         /* factor^3            */
      FT_16D16  length;

      FT_16D16_Vec  curve_point; /* point on the curve  */
      FT_16D16_Vec  dist_vector; /* `curve_point' - `p' */

      FT_26D6_Vec  d1;           /* first  derivative   */
      FT_26D6_Vec  d2;           /* second derivative   */

      FT_16D16  temp1;
      FT_16D16  temp2;


      for ( steps = 0; steps < MAX_NEWTON_STEPS; steps++ )
      {
        factor2 = FT_MulFix( factor, factor );
        factor3 = FT_MulFix( factor2, factor );

        /* B(t) = t^3 * A + t^2 * B + t * C + D */
        curve_point.x = FT_MulFix( aA.x, factor3 ) +
                        FT_MulFix( bB.x, factor2 ) +
                        FT_MulFix( cC.x, factor ) + dD.x;
        curve_point.y = FT_MulFix( aA.y, factor3 ) +
                        FT_MulFix( bB.y, factor2 ) +
                        FT_MulFix( cC.y, factor ) + dD.y;

        /* convert to 16.16 */
        curve_point.x = FT_26D6_16D16( curve_point.x );
        curve_point.y = FT_26D6_16D16( curve_point.y );

        /* P(t) in the comment */
        dist_vector.x = curve_point.x - FT_26D6_16D16( p.x );
        dist_vector.y = curve_point.y - FT_26D6_16D16( p.y );

        length = VECTOR_LENGTH_16D16( dist_vector );

        if ( length < min )
        {
          min           = length;
          min_factor    = factor;
          min_factor_sq = factor2;
          nearest_point = curve_point;
        }

        /* This the Newton's approximation.         */
        /*                                          */
        /*   t := P(t) . B'(t) /                    */
        /*          (B'(t) . B'(t) + P(t) . B''(t)) */

        /* B'(t) = 3t^2 * A + 2t * B + C */
        d1.x = FT_MulFix( aA.x, 3 * factor2 ) +
               FT_MulFix( bB.x, 2 * factor ) + cC.x;
        d1.y = FT_MulFix( aA.y, 3 * factor2 ) +
               FT_MulFix( bB.y, 2 * factor ) + cC.y;

        /* B''(t) = 6t * A + 2B */
        d2.x = FT_MulFix( aA.x, 6 * factor ) + 2 * bB.x;
        d2.y = FT_MulFix( aA.y, 6 * factor ) + 2 * bB.y;

        dist_vector.x /= 1024;
        dist_vector.y /= 1024;

        /* temp1 = P(t) . B'(t) */
        temp1 = VEC_26D6_DOT( dist_vector, d1 );

        /* temp2 = B'(t) . B'(t) + P(t) . B''(t) */
        temp2 = VEC_26D6_DOT( d1, d1 ) +
                VEC_26D6_DOT( dist_vector, d2 );

        factor -= FT_DivFix( temp1, temp2 );

        if ( factor < 0 || factor > FT_INT_16D16( 1 ) )
          break;
      }
    }

    /* B'(t) = 3t^2 * A + 2t * B + C */
    direction.x = FT_MulFix( aA.x, 3 * min_factor_sq ) +
                  FT_MulFix( bB.x, 2 * min_factor ) + cC.x;
    direction.y = FT_MulFix( aA.y, 3 * min_factor_sq ) +
                  FT_MulFix( bB.y, 2 * min_factor ) + cC.y;

    /* determine the sign */
    cross = FT_MulFix( nearest_point.x - FT_26D6_16D16( p.x ),
                       direction.y )                           -
            FT_MulFix( nearest_point.y - FT_26D6_16D16( p.y ),
                       direction.x );

    /* assign the values */
    out->distance = min;
    out->sign     = cross < 0 ? 1 : -1;

    if ( min_factor != 0 && min_factor != FT_INT_16D16( 1 ) )
      out->cross = FT_INT_16D16( 1 );   /* the two are perpendicular */
    else
    {
      /* convert to nearest vector */
      nearest_point.x -= FT_26D6_16D16( p.x );
      nearest_point.y -= FT_26D6_16D16( p.y );

      /* compute `cross` if not perpendicular */
      FT_Vector_NormLen( &direction );
      FT_Vector_NormLen( &nearest_point );

      out->cross = FT_MulFix( direction.x, nearest_point.y ) -
                   FT_MulFix( direction.y, nearest_point.x );
    }

  Exit:
    return error;
  }